

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall
pbrt::BinaryReader::read<std::__cxx11::string,std::shared_ptr<pbrt::Texture>>
          (BinaryReader *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
          *result)

{
  __shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int iVar1;
  int32_t size;
  shared_ptr<pbrt::Texture> t2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t1;
  int local_6c;
  __shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> local_68;
  key_type local_50;
  
  read<int,void>(this,&local_6c);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::clear(&result->_M_t);
  __buf = extraout_RDX;
  for (iVar1 = 0; iVar1 < local_6c; iVar1 = iVar1 + 1) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_68._M_ptr = (element_type *)0x0;
    local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    read(this,(int)&local_50,__buf,in_RCX);
    read<pbrt::Texture>(this,(shared_ptr<pbrt::Texture> *)&local_68);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
               ::operator[](result,&local_50)->
               super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__cxx11::string::~string((string *)&local_50);
    __buf = extraout_RDX_00;
  }
  return;
}

Assistant:

void read(std::map<T1,T2> &result)
    {
      int32_t size;
      read(size);
      result.clear();
      for (int i=0;i<size;i++) {
        T1 t1; T2 t2;
        read(t1);
        read(t2);
        result[t1] = t2;
      }
    }